

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O2

bool __thiscall
draco::KdTreeAttributesDecoder::DecodePortableAttributes
          (KdTreeAttributesDecoder *this,DecoderBuffer *in_buffer)

{
  byte num_components;
  DataType DVar1;
  Type attribute_type;
  pointer pIVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __uniq_ptr_data<draco::PointAttribute,_std::default_delete<draco::PointAttribute>,_true,_true>
  this_00;
  int c;
  uint uVar7;
  PointAttribute *this_01;
  ulong uVar8;
  uint8_t compression_level;
  size_t local_b8;
  int local_ac;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> port_att;
  OutIt out_it;
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  atts;
  
  if (in_buffer->bitstream_version_ < 0x203) {
    return true;
  }
  compression_level = '\0';
  bVar3 = DecoderBuffer::Decode<unsigned_char>(in_buffer,&compression_level);
  if (!bVar3) {
    return false;
  }
  iVar4 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
            _vptr_AttributesDecoderInterface[7])(this);
  local_b8 = (size_t)*(int *)(*(long *)(CONCAT44(extraout_var,iVar4) + 8) + 0xa0);
  iVar4 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
            _vptr_AttributesDecoderInterface[6])(this);
  std::
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ::vector(&atts,(long)iVar4,(allocator_type *)&out_it);
  iVar4 = 0;
  for (uVar8 = 0;
      iVar5 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[6])(this), (long)uVar8 < (long)iVar5;
      uVar8 = uVar8 + 1) {
    local_ac = iVar4;
    iVar4 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
              _vptr_AttributesDecoderInterface[5])(this,uVar8 & 0xffffffff);
    iVar5 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
              _vptr_AttributesDecoderInterface[7])(this);
    this_01 = *(PointAttribute **)
               (*(long *)(*(long *)(CONCAT44(extraout_var_00,iVar5) + 8) + 0x10) + (long)iVar4 * 8);
    PointAttribute::Reset(this_01,local_b8);
    this_01->identity_mapping_ = true;
    pIVar2 = (this_01->indices_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this_01->indices_map_).vector_.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar2) {
      (this_01->indices_map_).vector_.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar2;
    }
    DVar1 = (this_01->super_GeometryAttribute).data_type_;
    if (DT_FLOAT32 < DVar1) {
LAB_0014951d:
      bVar3 = false;
      goto LAB_001495bd;
    }
    if ((0x2aU >> (DVar1 & 0x1f) & 1) == 0) {
      if ((0x54U >> (DVar1 & 0x1f) & 1) == 0) {
        if (DVar1 != DT_FLOAT32) goto LAB_0014951d;
        num_components = (this_01->super_GeometryAttribute).num_components_;
        GeometryAttribute::GeometryAttribute((GeometryAttribute *)&out_it);
        attribute_type = (this_01->super_GeometryAttribute).attribute_type_;
        iVar6 = DataTypeLength(DT_UINT32);
        GeometryAttribute::Init
                  ((GeometryAttribute *)&out_it,attribute_type,(DataBuffer *)0x0,num_components,
                   DT_UINT32,false,(long)iVar6 * (ulong)num_components,0);
        this_00.
        super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
        _M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (__uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>)
             operator_new(0x70);
        PointAttribute::PointAttribute
                  ((PointAttribute *)
                   this_00.
                   super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,
                   (GeometryAttribute *)&out_it);
        *(bool *)((long)this_00.
                        super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 100) =
             true;
        pIVar2 = (((IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                    *)((long)this_00.
                             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                             .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                      0x48))->vector_).
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)this_00.
                    super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                    .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x50) !=
            pIVar2) {
          *(pointer *)
           ((long)this_00.
                  super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                  .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x50) =
               pIVar2;
        }
        port_att._M_t.
        super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
        _M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (__uniq_ptr_data<draco::PointAttribute,_std::default_delete<draco::PointAttribute>,_true,_true>
              )(__uniq_ptr_data<draco::PointAttribute,_std::default_delete<draco::PointAttribute>,_true,_true>
                )this_00.
                 super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
        PointAttribute::Reset
                  ((PointAttribute *)
                   this_00.
                   super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                   .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,local_b8);
        std::
        vector<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>,std::allocator<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>>
        ::
        emplace_back<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>
                  ((vector<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>,std::allocator<std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>>>
                    *)&this->quantized_portable_attributes_,&port_att);
        this_01 = (this->quantized_portable_attributes_).
                  super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                  .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
        std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
        ~unique_ptr(&port_att);
      }
    }
    else {
      for (uVar7 = 0; uVar7 < (this_01->super_GeometryAttribute).num_components_; uVar7 = uVar7 + 1)
      {
        out_it.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&this->min_signed_values_,(int *)&out_it);
      }
    }
    DVar1 = (this_01->super_GeometryAttribute).data_type_;
    out_it.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = DataTypeLength(DVar1);
    iVar4 = local_ac;
    if (out_it.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ < 1) {
      out_it.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 0;
    }
    uVar7 = (uint)(this_01->super_GeometryAttribute).num_components_;
    out_it.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = local_ac;
    out_it.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar7;
    out_it.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = DVar1;
    out_it.memory_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this_01;
    std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>::
    operator=(atts.
              super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar8,(type)&out_it);
    iVar4 = iVar4 + uVar7;
  }
  PointAttributeVectorOutputIterator<unsigned_int>::PointAttributeVectorOutputIterator
            (&out_it,&atts);
  iVar5 = (int)local_b8;
  switch(compression_level) {
  case '\0':
    bVar3 = DecodePoints<0,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,iVar4,iVar5,in_buffer,&out_it);
    break;
  case '\x01':
    bVar3 = DecodePoints<1,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,iVar4,iVar5,in_buffer,&out_it);
    break;
  case '\x02':
    bVar3 = DecodePoints<2,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,iVar4,iVar5,in_buffer,&out_it);
    break;
  case '\x03':
    bVar3 = DecodePoints<3,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,iVar4,iVar5,in_buffer,&out_it);
    break;
  case '\x04':
    bVar3 = DecodePoints<4,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,iVar4,iVar5,in_buffer,&out_it);
    break;
  case '\x05':
    bVar3 = DecodePoints<5,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,iVar4,iVar5,in_buffer,&out_it);
    break;
  case '\x06':
    bVar3 = DecodePoints<6,draco::PointAttributeVectorOutputIterator<unsigned_int>>
                      (this,iVar4,iVar5,in_buffer,&out_it);
    break;
  default:
    goto switchD_00149502_default;
  }
  if (bVar3 == false) {
switchD_00149502_default:
    bVar3 = false;
  }
  else {
    bVar3 = true;
  }
  PointAttributeVectorOutputIterator<unsigned_int>::~PointAttributeVectorOutputIterator(&out_it);
LAB_001495bd:
  std::
  _Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&atts.
                   super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                 );
  return bVar3;
}

Assistant:

bool KdTreeAttributesDecoder::DecodePortableAttributes(
    DecoderBuffer *in_buffer) {
  if (in_buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 3)) {
    // Old bitstream does everything in the
    // DecodeDataNeededByPortableTransforms() method.
    return true;
  }
  uint8_t compression_level = 0;
  if (!in_buffer->Decode(&compression_level)) {
    return false;
  }
  const int32_t num_points = GetDecoder()->point_cloud()->num_points();

  // Decode data using the kd tree decoding into integer (portable) attributes.
  // We first need to go over all attributes and create a new portable storage
  // for those attributes that need it (floating point attributes that have to
  // be dequantized after decoding).

  const int num_attributes = GetNumAttributes();
  uint32_t total_dimensionality = 0;  // position is a required dimension
  std::vector<AttributeTuple> atts(num_attributes);

  for (int i = 0; i < GetNumAttributes(); ++i) {
    const int att_id = GetAttributeId(i);
    PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
    // All attributes have the same number of values and identity mapping
    // between PointIndex and AttributeValueIndex.
    att->Reset(num_points);
    att->SetIdentityMapping();

    PointAttribute *target_att = nullptr;
    if (att->data_type() == DT_UINT32 || att->data_type() == DT_UINT16 ||
        att->data_type() == DT_UINT8) {
      // We can decode to these attributes directly.
      target_att = att;
    } else if (att->data_type() == DT_INT32 || att->data_type() == DT_INT16 ||
               att->data_type() == DT_INT8) {
      // Prepare storage for data that is used to convert unsigned values back
      // to the signed ones.
      for (int c = 0; c < att->num_components(); ++c) {
        min_signed_values_.push_back(0);
      }
      target_att = att;
    } else if (att->data_type() == DT_FLOAT32) {
      // Create a portable attribute that will hold the decoded data. We will
      // dequantize the decoded data to the final attribute later on.
      const int num_components = att->num_components();
      GeometryAttribute va;
      va.Init(att->attribute_type(), nullptr, num_components, DT_UINT32, false,
              num_components * DataTypeLength(DT_UINT32), 0);
      std::unique_ptr<PointAttribute> port_att(new PointAttribute(va));
      port_att->SetIdentityMapping();
      port_att->Reset(num_points);
      quantized_portable_attributes_.push_back(std::move(port_att));
      target_att = quantized_portable_attributes_.back().get();
    } else {
      // Unsupported type.
      return false;
    }
    // Add attribute to the output iterator used by the core algorithm.
    const DataType data_type = target_att->data_type();
    const uint32_t data_size = (std::max)(0, DataTypeLength(data_type));
    const uint32_t num_components = target_att->num_components();
    atts[i] = std::make_tuple(target_att, total_dimensionality, data_type,
                              data_size, num_components);
    total_dimensionality += num_components;
  }
  typedef PointAttributeVectorOutputIterator<uint32_t> OutIt;
  OutIt out_it(atts);

  switch (compression_level) {
    case 0: {
      if (!DecodePoints<0, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 1: {
      if (!DecodePoints<1, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 2: {
      if (!DecodePoints<2, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 3: {
      if (!DecodePoints<3, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 4: {
      if (!DecodePoints<4, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 5: {
      if (!DecodePoints<5, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    case 6: {
      if (!DecodePoints<6, OutIt>(total_dimensionality, num_points, in_buffer,
                                  &out_it)) {
        return false;
      }
      break;
    }
    default:
      return false;
  }
  return true;
}